

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int scan_directory(mg_connection *conn,char *dir,void *data,_func_int_de_ptr_void_ptr *cb)

{
  int iVar1;
  dirent64 *pdVar2;
  int *piVar3;
  char *pcVar4;
  int local_1074;
  undefined1 auStack_1070 [4];
  int truncated;
  de de;
  DIR *dirp;
  dirent *dp;
  char path [4096];
  _func_int_de_ptr_void_ptr *cb_local;
  void *data_local;
  char *dir_local;
  mg_connection *conn_local;
  
  de.file._24_8_ = opendir(dir);
  if ((DIR *)de.file._24_8_ == (DIR *)0x0) {
    conn_local._4_4_ = 0;
  }
  else {
    do {
      do {
        do {
          pdVar2 = readdir64((DIR *)de.file._24_8_);
          if (pdVar2 == (dirent64 *)0x0) goto LAB_00129c48;
          iVar1 = strcmp(pdVar2->d_name,".");
        } while (((iVar1 == 0) || (iVar1 = strcmp(pdVar2->d_name,".."), iVar1 == 0)) ||
                (iVar1 = must_hide_file(conn,pdVar2->d_name), iVar1 != 0));
        mg_snprintf(conn,&local_1074,(char *)&dp,0x1000,"%s/%s",dir,pdVar2->d_name);
        memset(&de,0,0x20);
      } while (local_1074 != 0);
      iVar1 = mg_stat(conn,(char *)&dp,(mg_file_stat *)&de);
      if (iVar1 == 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        mg_cry_internal_wrap
                  (conn,(mg_context *)0x0,"scan_directory",0x265b,"%s: mg_stat(%s) failed: %s",
                   "scan_directory",&dp,pcVar4);
      }
      _auStack_1070 = pdVar2->d_name;
      iVar1 = (*cb)((de *)auStack_1070,data);
    } while (iVar1 == 0);
LAB_00129c48:
    closedir((DIR *)de.file._24_8_);
    conn_local._4_4_ = 1;
  }
  return conn_local._4_4_;
}

Assistant:

static int
scan_directory(struct mg_connection *conn,
               const char *dir,
               void *data,
               int (*cb)(struct de *, void *))
{
	char path[UTF8_PATH_MAX];
	struct dirent *dp;
	DIR *dirp;
	struct de de;
	int truncated;

	if ((dirp = mg_opendir(conn, dir)) == NULL) {
		return 0;
	} else {

		while ((dp = mg_readdir(dirp)) != NULL) {
			/* Do not show current dir and hidden files */
			if (!strcmp(dp->d_name, ".") || !strcmp(dp->d_name, "..")
			    || must_hide_file(conn, dp->d_name)) {
				continue;
			}

			mg_snprintf(
			    conn, &truncated, path, sizeof(path), "%s/%s", dir, dp->d_name);

			/* If we don't memset stat structure to zero, mtime will have
			 * garbage and strftime() will segfault later on in
			 * print_dir_entry(). memset is required only if mg_stat()
			 * fails. For more details, see
			 * http://code.google.com/p/mongoose/issues/detail?id=79 */
			memset(&de.file, 0, sizeof(de.file));

			if (truncated) {
				/* If the path is not complete, skip processing. */
				continue;
			}

			if (!mg_stat(conn, path, &de.file)) {
				mg_cry_internal(conn,
				                "%s: mg_stat(%s) failed: %s",
				                __func__,
				                path,
				                strerror(ERRNO));
			}
			de.file_name = dp->d_name;
			if (cb(&de, data)) {
				/* stopped */
				break;
			}
		}
		(void)mg_closedir(dirp);
	}
	return 1;
}